

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool anon_unknown.dwarf_b837c::SameArguments(TypeFunction *a,TypeFunction *b)

{
  TypeHandle *pTVar1;
  TypeHandle *pTVar2;
  IntrusiveList<TypeHandle> *pIVar3;
  IntrusiveList<TypeHandle> *pIVar4;
  
  pIVar4 = &a->arguments;
  pIVar3 = &b->arguments;
  while( true ) {
    pTVar1 = pIVar3->head;
    pTVar2 = pIVar4->head;
    if ((pTVar2 == (TypeHandle *)0x0) || (pTVar1 == (TypeHandle *)0x0)) break;
    if (pTVar2->type != pTVar1->type) {
      return false;
    }
    pIVar4 = (IntrusiveList<TypeHandle> *)&pTVar2->next;
    pIVar3 = (IntrusiveList<TypeHandle> *)&pTVar1->next;
  }
  return pTVar2 == pTVar1;
}

Assistant:

bool SameArguments(TypeFunction *a, TypeFunction *b)
	{
		TypeHandle *ca = a->arguments.head;
		TypeHandle *cb = b->arguments.head;

		for(; ca && cb; ca = ca->next, cb = cb->next)
		{
			if(ca->type != cb->type)
				return false;
		}

		return ca == cb;
	}